

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

void ma_job_queue_uninit(ma_job_queue *pQueue,ma_allocation_callbacks *pAllocationCallbacks)

{
  if (pQueue != (ma_job_queue *)0x0) {
    if ((pQueue->flags & 1) == 0) {
      pthread_cond_destroy((pthread_cond_t *)&(pQueue->sem).cond);
      pthread_mutex_destroy((pthread_mutex_t *)&(pQueue->sem).lock);
    }
    if ((pQueue->allocator)._ownsHeap != 0) {
      ma_free((pQueue->allocator)._pHeap,pAllocationCallbacks);
    }
    if (pQueue->_ownsHeap != 0) {
      ma_free(pQueue->_pHeap,pAllocationCallbacks);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_job_queue_uninit(ma_job_queue* pQueue, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pQueue == NULL) {
        return;
    }

    /* All we need to do is uninitialize the semaphore. */
    if ((pQueue->flags & MA_JOB_QUEUE_FLAG_NON_BLOCKING) == 0) {
        #ifndef MA_NO_THREADING
        {
            ma_semaphore_uninit(&pQueue->sem);
        }
        #else
        {
            MA_ASSERT(MA_FALSE);    /* Should never get here. Should have been checked at initialization time. */
        }
        #endif
    }

    ma_slot_allocator_uninit(&pQueue->allocator, pAllocationCallbacks);

    if (pQueue->_ownsHeap) {
        ma_free(pQueue->_pHeap, pAllocationCallbacks);
    }
}